

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<long>::Swap(RepeatedField<long> *this,RepeatedField<long> *other)

{
  void *pvVar1;
  long *plVar2;
  void **ppvVar3;
  RepeatedField<long> temp;
  RepeatedField<long> RStack_28;
  
  if (this != other) {
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    else {
      plVar2 = elements(this);
      ppvVar3 = (void **)(plVar2 + -1);
    }
    pvVar1 = *ppvVar3;
    if (other->total_size_ == 0) {
      ppvVar3 = &other->arena_or_elements_;
    }
    else {
      plVar2 = elements(other);
      ppvVar3 = (void **)(plVar2 + -1);
    }
    if (pvVar1 == *ppvVar3) {
      InternalSwap(this,other);
      return;
    }
    if (other->total_size_ == 0) {
      ppvVar3 = &other->arena_or_elements_;
    }
    else {
      plVar2 = elements(other);
      ppvVar3 = (void **)(plVar2 + -1);
    }
    RepeatedField(&RStack_28,(Arena *)*ppvVar3);
    MergeFrom(&RStack_28,this);
    this->current_size_ = 0;
    MergeFrom(this,other);
    if (&RStack_28 != other) {
      InternalSwap(other,&RStack_28);
    }
    ~RepeatedField(&RStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}